

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnForward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *F,
          DecomposeType dec)

{
  double dVar1;
  uint uVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ostream *poVar7;
  long *plVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  complex<double> *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined8 *puVar19;
  undefined8 uVar20;
  complex<double> udiag;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  long local_40;
  ulong local_38;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar17 = (ulong)(uint)this->fNumEq;
    if (0 < this->fNumEq) {
      uVar16 = 0;
      do {
        uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar16];
        lVar14 = (long)(int)uVar2;
        pcVar13 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                  super_TPZVec<std::complex<double>_>.fStore;
        lVar11 = lVar14 * 0x10;
        dVar1 = *(double *)pcVar13[lVar14]._M_value;
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
            (dVar1 = *(double *)(pcVar13[lVar14]._M_value + 8), dVar1 == 0.0)) && (!NAN(dVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," Equation = ",0xc);
          plVar8 = (long *)std::ostream::operator<<(poVar7,(int)uVar16);
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0x8b);
        }
        if (uVar16 == (int)uVar17 - 1) {
          iVar10 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                        super_TPZVec<std::complex<double>_>.fNElements;
        }
        else {
          iVar10 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
                   [uVar16 + 1];
        }
        piVar9 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar15 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        lVar18 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
        local_38 = uVar16;
        if ((dec & ~ELUPivot) == ELU) {
          pcVar13 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                    super_TPZVec<std::complex<double>_>.fStore + lVar14;
          lVar12 = (long)piVar9[lVar14];
          if ((lVar18 < 1 || lVar12 < 0) || lVar15 <= lVar12) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar3 = F->fElem;
          uVar20 = *(undefined8 *)(pcVar3[lVar12]._M_value + 8);
          uVar4 = __divdc3((int)*(undefined8 *)pcVar3[lVar12]._M_value,uVar20,
                           *(undefined8 *)pcVar13->_M_value,*(undefined8 *)(pcVar13->_M_value + 8));
          *(undefined8 *)pcVar3[lVar12]._M_value = uVar4;
          *(undefined8 *)(pcVar3[lVar12]._M_value + 8) = uVar20;
          piVar9 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
          lVar15 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          lVar18 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
        }
        lVar12 = (long)piVar9[lVar14];
        local_40 = lVar11;
        if (((lVar12 < 0) || (lVar15 <= lVar12)) || (lVar18 < 1)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_58 = *(double *)F->fElem[lVar12]._M_value;
        dStack_50 = *(double *)(F->fElem[lVar12]._M_value + 8);
        lVar11 = lVar14 + 1;
        if ((int)lVar11 < iVar10) {
          lVar15 = lVar11 * 0x10;
          iVar10 = ~uVar2 + iVar10;
          do {
            local_68 = local_58;
            dStack_60 = dStack_50;
            std::complex<double>::operator*=
                      ((complex<double> *)&local_68,
                       (complex<double> *)
                       (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                         super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar15));
            lVar18 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar11];
            if (((lVar18 < 0) ||
                ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar18)) ||
               ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar13 = F->fElem + lVar18;
            dVar1 = *(double *)(pcVar13->_M_value + 8) - dStack_60;
            auVar6._8_4_ = SUB84(dVar1,0);
            auVar6._0_8_ = *(double *)pcVar13->_M_value - local_68;
            auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
            *(undefined1 (*) [16])F->fElem[lVar18]._M_value = auVar6;
            lVar11 = lVar11 + 1;
            lVar15 = lVar15 + 0x10;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        if (dec == ELDLt) {
          puVar19 = (undefined8 *)
                    (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                      super_TPZVec<std::complex<double>_>.fStore)->_M_value + local_40);
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar14];
          if (((lVar11 < 0) ||
              ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
             ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar13 = F->fElem;
          uVar20 = *(undefined8 *)(pcVar13[lVar11]._M_value + 8);
          uVar4 = __divdc3((int)*(undefined8 *)pcVar13[lVar11]._M_value,uVar20,*puVar19,puVar19[1]);
          *(undefined8 *)pcVar13[lVar11]._M_value = uVar4;
          *(undefined8 *)(pcVar13[lVar11]._M_value + 8) = uVar20;
        }
        uVar16 = local_38 + 1;
        uVar17 = (ulong)this->fNumEq;
      } while ((long)uVar16 < (long)uVar17);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (iVar10 = this->fNumEq, 1 < iVar10)) {
    uVar17 = 1;
    do {
      uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar17];
      lVar11 = (long)(int)uVar2;
      pcVar13 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                super_TPZVec<std::complex<double>_>.fStore;
      dVar1 = *(double *)pcVar13[lVar11]._M_value;
      if (((dVar1 == 0.0) && (!NAN(dVar1))) &&
         ((dVar1 = *(double *)(pcVar13[lVar11]._M_value + 8), dVar1 == 0.0 && (!NAN(dVar1))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," Equation = ",0xc);
        plVar8 = (long *)std::ostream::operator<<(poVar7,(int)uVar17);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar17 == iVar10 - 1) {
        iVar10 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                      super_TPZVec<std::complex<double>_>.fNElements;
      }
      else {
        iVar10 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar17 + 1];
      }
      piVar9 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
      lVar14 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
      lVar15 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
      if ((dec & ~ELUPivot) == ELU) {
        pcVar13 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                  super_TPZVec<std::complex<double>_>.fStore + lVar11;
        lVar18 = (long)piVar9[lVar11];
        if ((lVar15 < 1 || lVar18 < 0) || lVar14 <= lVar18) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar3 = F->fElem;
        uVar20 = *(undefined8 *)(pcVar3[lVar18]._M_value + 8);
        uVar4 = __divdc3((int)*(undefined8 *)pcVar3[lVar18]._M_value,uVar20,
                         *(undefined8 *)pcVar13->_M_value,*(undefined8 *)(pcVar13->_M_value + 8));
        *(undefined8 *)pcVar3[lVar18]._M_value = uVar4;
        *(undefined8 *)(pcVar3[lVar18]._M_value + 8) = uVar20;
        piVar9 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        lVar14 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        lVar15 = (F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
      }
      lVar18 = (long)piVar9[lVar11];
      if (((lVar18 < 0) || (lVar14 <= lVar18)) || (lVar15 < 1)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_58 = *(double *)F->fElem[lVar18]._M_value;
      dStack_50 = *(double *)(F->fElem[lVar18]._M_value + 8);
      lVar11 = lVar11 + 1;
      if ((int)lVar11 < iVar10) {
        lVar14 = lVar11 * 0x10;
        iVar10 = ~uVar2 + iVar10;
        do {
          local_68 = local_58;
          dStack_60 = dStack_50;
          std::complex<double>::operator*=
                    ((complex<double> *)&local_68,
                     (complex<double> *)
                     (((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                       super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar14));
          lVar15 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar11];
          if (((lVar15 < 0) ||
              ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar15)) ||
             ((F->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar13 = F->fElem + lVar15;
          dVar1 = *(double *)(pcVar13->_M_value + 8) - dStack_60;
          auVar5._8_4_ = SUB84(dVar1,0);
          auVar5._0_8_ = *(double *)pcVar13->_M_value - local_68;
          auVar5._12_4_ = (int)((ulong)dVar1 >> 0x20);
          *(undefined1 (*) [16])F->fElem[lVar15]._M_value = auVar5;
          lVar11 = lVar11 + 1;
          lVar14 = lVar14 + 0x10;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      uVar17 = uVar17 + 2;
      iVar10 = this->fNumEq;
    } while ((int)uVar17 < iVar10);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}